

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O0

cf_bool_t cf_str_strip(cf_char_t *s)

{
  size_t sVar1;
  ulong uVar2;
  bool bVar3;
  ulong local_38;
  cf_size_t i;
  cf_size_t len;
  cf_char_t *end;
  cf_char_t *start;
  cf_char_t *s_local;
  
  if (s == (cf_char_t *)0x0) {
    s_local._4_4_ = 0;
  }
  else {
    sVar1 = strlen(s);
    end = s;
    if (sVar1 == 0) {
      s_local._4_4_ = 1;
    }
    else {
      while( true ) {
        bVar3 = true;
        if ((*end != '\t') && (bVar3 = true, *end != '\n')) {
          bVar3 = *end == ' ';
        }
        if (!bVar3) break;
        end = end + 1;
      }
      if (*end == '\0') {
        *s = '\0';
        s_local._4_4_ = 1;
      }
      else {
        len = (cf_size_t)(s + sVar1);
        do {
          len = len - 1;
          bVar3 = true;
          if ((*(char *)len != '\t') && (bVar3 = true, *(char *)len != '\n')) {
            bVar3 = *(char *)len == ' ';
          }
        } while (bVar3);
        uVar2 = (len - (long)end) + 1;
        for (local_38 = 0; local_38 < uVar2; local_38 = local_38 + 1) {
          s[local_38] = end[local_38];
        }
        s[uVar2] = '\0';
        s_local._4_4_ = 1;
      }
    }
  }
  return s_local._4_4_;
}

Assistant:

cf_bool_t cf_str_strip(cf_char_t* s) {
    cf_char_t* start = CF_NULL_PTR;
    cf_char_t* end = CF_NULL_PTR;
    cf_size_t len = 0;
    cf_size_t i = 0;
    if (!s) return CF_FALSE;

    len = strlen(s);
    if (len == 0) return CF_TRUE;

    /* strip left */
    start = s;
    while (CF_IS_SPACE(*start)) {
        start++;
    }
    // all chars are \b or \t
    if (*start == '\0') {
        s[0] = '\0';
        return CF_TRUE;
    }

    /* strip right */
    end = s + len - 1;
    while (CF_IS_SPACE(*end)) {
        end--;
    }

    len = end - start + 1;    
    for (i = 0; i < len; i++) {
        s[i] = *(start + i);
    }
    s[len] = '\0';
    return CF_TRUE;
}